

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O1

bool __thiscall
udpdiscovery::Packet::Serialize
          (Packet *this,ProtocolVersion protocol_version,SerializeDirection direction,
          BufferView *buffer_view)

{
  bool bVar1;
  ulong in_RAX;
  int iVar2;
  uint16_t user_data_size;
  uint16_t padding_size;
  uint8_t reserved;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (direction == kSerialize) {
    uStack_38._0_1_ = (undefined1)in_RAX;
    uStack_38._2_6_ = (undefined6)(in_RAX >> 0x10);
    if (protocol_version == kProtocolVersion0) {
      uStack_38._0_2_ = CONCAT11(0x55,(undefined1)uStack_38);
    }
    else {
      if (protocol_version != kProtocolVersion1) {
        return false;
      }
      uStack_38._0_2_ = CONCAT11(0x56,(undefined1)uStack_38);
    }
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
    std::__cxx11::string::push_back((char)buffer_view->buffer_);
  }
  uStack_38 = uStack_38 & 0xffffffffffffff;
  iVar2 = 3;
  do {
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                      (direction,(uchar *)((long)&uStack_38 + 7),buffer_view);
    if (!bVar1) {
      return false;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                    (direction,&this->packet_type_,buffer_view);
  if ((bVar1) &&
     ((((direction != kParse || (this->packet_type_ < 2)) &&
       (bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                          (direction,&this->application_id_,buffer_view), bVar1)) &&
      ((bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                          (direction,&this->peer_id_,buffer_view), bVar1 &&
       (bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
                          (direction,&this->snapshot_index_,buffer_view), bVar1)))))) {
    uStack_38._0_4_ = CONCAT22((short)(this->user_data_)._M_string_length,(undefined2)uStack_38);
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                      (direction,(unsigned_short *)((long)&uStack_38 + 2),buffer_view);
    if (bVar1) {
      if (direction == kParse) {
        if (protocol_version == kProtocolVersion0) {
          if (0x8000 < uStack_38._2_2_) {
            return false;
          }
        }
        else if ((protocol_version == kProtocolVersion1) && (0x1000 < uStack_38._2_2_)) {
          return false;
        }
      }
      uStack_38._0_6_ = (uint6)(uint)uStack_38;
      if (protocol_version == kProtocolVersion0) {
        bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                          (direction,(unsigned_short *)((long)&uStack_38 + 4),buffer_view);
        if (!bVar1) {
          return false;
        }
        if (0x8000 < uStack_38._4_2_) {
          return false;
        }
      }
      if ((direction != kParse) ||
         ((int)buffer_view->buffer_->_M_string_length - buffer_view->parsed_ ==
          (uint)uStack_38._4_2_ + (uint)uStack_38._2_2_)) {
        bVar1 = impl::SerializeString(direction,&this->user_data_,(uint)uStack_38._2_2_,buffer_view)
        ;
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       impl::SerializeDirection direction,
                       impl::BufferView* buffer_view) {
  if (direction == impl::kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      buffer_view->push_back('R');
      buffer_view->push_back('N');
      buffer_view->push_back('6');
      buffer_view->push_back('U');
    } else if (protocol_version == kProtocolVersion1) {
      buffer_view->push_back('S');
      buffer_view->push_back('O');
      buffer_view->push_back('7');
      buffer_view->push_back('V');
    } else {
      return false;
    }

    uint8_t version = protocol_version;
    impl::SerializeUnsignedIntegerBigEndian(impl::kSerialize, &version,
                                            buffer_view);
  }

  uint8_t reserved = 0;
  for (int i = 0; i < 3; ++i) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &reserved,
                                                 buffer_view)) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &packet_type_,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (impl::GetPacketType(packet_type_) == kPacketTypeUnknown) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &application_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &peer_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &snapshot_index_,
                                               buffer_view)) {
    return false;
  }

  uint16_t user_data_size = (uint16_t)user_data_.size();
  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &user_data_size,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (user_data_size > kMaxUserDataSizeV0) {
        return false;
      }
    } else if (protocol_version == kProtocolVersion1) {
      if (user_data_size > kMaxUserDataSizeV1) {
        return false;
      }
    }
  }

  uint16_t padding_size = 0;
  if (protocol_version == kProtocolVersion0) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &padding_size,
                                                 buffer_view)) {
      return false;
    }

    if (padding_size > kMaxPaddingSizeV0) {
      return false;
    }
  }

  // End of serializing header.

  if (direction == impl::kParse) {
    if (buffer_view->LeftUnparsed() != user_data_size + padding_size) {
      return false;
    }
  }

  if (!impl::SerializeString(direction, &user_data_, user_data_size,
                             buffer_view)) {
    return false;
  }

  // Do not serialize padding even for protocol version 0.

  return true;
}